

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void pacify_shk(monst *shkp)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  
  shkp->field_0x62 = shkp->field_0x62 | 0x40;
  if (*(char *)((long)&shkp[0x1b].meating + 2) != '\0') {
    lVar1 = *(long *)&shkp[0x1b].mnum;
    *(undefined1 *)((long)&shkp[0x1b].meating + 2) = 0;
    piVar2 = (int *)(lVar1 + 8);
    for (iVar3 = (int)*(short *)((long)&shkp[0x1b].misc_worn_check + 2); 0 < iVar3;
        iVar3 = iVar3 + -1) {
      *piVar2 = (int)(((long)*piVar2 + 3) / -4) + *piVar2;
      piVar2 = piVar2 + 4;
    }
  }
  return;
}

Assistant:

static void pacify_shk(struct monst *shkp)
{
	NOTANGRY(shkp) = TRUE;	/* make peaceful */
	if (ESHK(shkp)->surcharge) {
		struct bill_x *bp = ESHK(shkp)->bill_p;
		int ct = ESHK(shkp)->billct;

		ESHK(shkp)->surcharge = FALSE;
		while (ct-- > 0) {
			long reduction = (bp->price + 3L) / 4L;
			bp->price -= reduction;		/* undo 33% increase */
			bp++;
		}
	}
}